

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

void GF2::Env::RandMem(void *pMem,size_t size)

{
  u32 uVar1;
  long lVar2;
  u32 rnd;
  undefined1 local_4 [4];
  
  if (size != 0) {
    if (7 < size) {
      lVar2 = (size >> 2) - 1;
      uVar1 = _randx;
      _randy = _randy;
      do {
        _randx = _randy;
        _randy = uVar1 * _randx;
        _randz = (_randz >> 0x10) + (_randz & 0xffff) * 0x78b7;
        *(u32 *)pMem = _randz + _randy;
        pMem = (void *)((long)pMem + 4);
        lVar2 = lVar2 + -1;
        uVar1 = _randx;
      } while (lVar2 != 0);
    }
    uVar1 = _randx * _randy;
    _randz = (_randz >> 0x10) + (_randz & 0xffff) * 0x78b7;
    _randx = _randy;
    if ((size & 3) == 0) {
      _randy = uVar1;
      *(u32 *)pMem = _randz + uVar1;
    }
    else {
      _randy = uVar1;
      memcpy(pMem,local_4,size & 3);
    }
  }
  return;
}

Assistant:

void Env::RandMem(void* pMem, size_t size)
{
	if (size == 0) return;
	u32* pMem32 = (u32*)pMem;
	// заполняем все слова, кроме последнего (возможно неполного)
	for (size_t i = 0; i + 1 < size / 4; *(pMem32++) = Rand(), ++i);
	// заполняем последнее слово
	u32 rnd = Rand();
	if (size %= 4)
		::memcpy(pMem32, &rnd, size);
	else
		*pMem32 = rnd;
}